

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::CreateInvocationsVectorOperation
          (TGlslangToSpvTraverser *this,Op op,GroupOperation groupOperation,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands)

{
  Id IVar1;
  reference pvVar2;
  bool bVar3;
  Id local_bc;
  IdImmediate local_b8;
  IdImmediate groupOp;
  IdImmediate scope_1;
  IdImmediate operand_1;
  IdImmediate scope;
  IdImmediate operand;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  IdImmediate scalar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  undefined1 local_48 [4];
  int comp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  Id scalarType;
  int numComponents;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Id typeId_local;
  GroupOperation groupOperation_local;
  Op op_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar3 = true;
  if (((((((op != OpGroupFMin) && (bVar3 = true, op != OpGroupUMin)) &&
         (bVar3 = true, op != OpGroupSMin)) &&
        ((bVar3 = true, op != OpGroupFMax && (bVar3 = true, op != OpGroupUMax)))) &&
       ((bVar3 = true, op != OpGroupSMax &&
        ((bVar3 = true, op != OpGroupFAdd && (bVar3 = true, op != OpGroupIAdd)))))) &&
      (bVar3 = true, op != OpGroupBroadcast)) &&
     (((((bVar3 = true, op != OpSubgroupReadInvocationKHR &&
         (bVar3 = true, op != OpSubgroupFirstInvocationKHR)) &&
        (bVar3 = true, op != OpGroupFMinNonUniformAMD)) &&
       (((bVar3 = true, op != OpGroupUMinNonUniformAMD &&
         (bVar3 = true, op != OpGroupSMinNonUniformAMD)) &&
        ((bVar3 = true, op != OpGroupFMaxNonUniformAMD &&
         ((bVar3 = true, op != OpGroupUMaxNonUniformAMD &&
          (bVar3 = true, op != OpGroupSMaxNonUniformAMD)))))))) &&
      (bVar3 = true, op != OpGroupFAddNonUniformAMD)))) {
    bVar3 = op == OpGroupIAddNonUniformAMD;
  }
  if (bVar3) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operands,0);
    results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::getNumComponents(&this->builder,*pvVar2);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operands,0);
    IVar1 = spv::Builder::getTypeId(&this->builder,*pvVar2);
    results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         spv::Builder::getScalarTypeId(&this->builder,IVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    for (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ <
        (int)results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
        indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&scalar.word);
      scalar._0_4_ = indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&scalar.word,
                 (value_type_conflict *)&scalar);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operands,0);
      IVar1 = spv::Builder::createCompositeExtract
                        (&this->builder,*pvVar2,
                         (Id)results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&scalar.word);
      spv::IdImmediate::IdImmediate
                ((IdImmediate *)
                 ((long)&spvGroupOperands.
                         super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),true,IVar1);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand);
      if (op == OpSubgroupReadInvocationKHR) {
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,
                   (value_type *)
                   ((long)&spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operands,1);
        spv::IdImmediate::IdImmediate(&scope,true,*pvVar2);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,&scope);
      }
      else if (op == OpSubgroupFirstInvocationKHR) {
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,
                   (value_type *)
                   ((long)&spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      else if (op == OpGroupBroadcast) {
        IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
        spv::IdImmediate::IdImmediate(&operand_1,true,IVar1);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,
                   &operand_1);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,
                   (value_type *)
                   ((long)&spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operands,1);
        spv::IdImmediate::IdImmediate(&scope_1,true,*pvVar2);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,&scope_1)
        ;
      }
      else {
        IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
        spv::IdImmediate::IdImmediate(&groupOp,true,IVar1);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,&groupOp)
        ;
        spv::IdImmediate::IdImmediate(&local_b8,false,groupOperation);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,&local_b8
                  );
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand,
                   (value_type *)
                   ((long)&spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      local_bc = spv::Builder::createOp
                           (&this->builder,op,
                            (Id)results.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,&local_bc);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&operand);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&scalar.word);
    }
    IVar1 = spv::Builder::createCompositeConstruct
                      (&this->builder,typeId,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    return IVar1;
  }
  __assert_fail("op == spv::OpGroupFMin || op == spv::OpGroupUMin || op == spv::OpGroupSMin || op == spv::OpGroupFMax || op == spv::OpGroupUMax || op == spv::OpGroupSMax || op == spv::OpGroupFAdd || op == spv::OpGroupIAdd || op == spv::OpGroupBroadcast || op == spv::OpSubgroupReadInvocationKHR || op == spv::OpSubgroupFirstInvocationKHR || op == spv::OpGroupFMinNonUniformAMD || op == spv::OpGroupUMinNonUniformAMD || op == spv::OpGroupSMinNonUniformAMD || op == spv::OpGroupFMaxNonUniformAMD || op == spv::OpGroupUMaxNonUniformAMD || op == spv::OpGroupSMaxNonUniformAMD || op == spv::OpGroupFAddNonUniformAMD || op == spv::OpGroupIAddNonUniformAMD"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                ,0x21e5,
                "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::CreateInvocationsVectorOperation(spv::Op, spv::GroupOperation, spv::Id, std::vector<spv::Id> &)"
               );
}

Assistant:

spv::Id TGlslangToSpvTraverser::CreateInvocationsVectorOperation(spv::Op op, spv::GroupOperation groupOperation,
    spv::Id typeId, std::vector<spv::Id>& operands)
{
    assert(op == spv::OpGroupFMin || op == spv::OpGroupUMin || op == spv::OpGroupSMin ||
           op == spv::OpGroupFMax || op == spv::OpGroupUMax || op == spv::OpGroupSMax ||
           op == spv::OpGroupFAdd || op == spv::OpGroupIAdd || op == spv::OpGroupBroadcast ||
           op == spv::OpSubgroupReadInvocationKHR || op == spv::OpSubgroupFirstInvocationKHR ||
           op == spv::OpGroupFMinNonUniformAMD || op == spv::OpGroupUMinNonUniformAMD ||
           op == spv::OpGroupSMinNonUniformAMD ||
           op == spv::OpGroupFMaxNonUniformAMD || op == spv::OpGroupUMaxNonUniformAMD ||
           op == spv::OpGroupSMaxNonUniformAMD ||
           op == spv::OpGroupFAddNonUniformAMD || op == spv::OpGroupIAddNonUniformAMD);

    // Handle group invocation operations scalar by scalar.
    // The result type is the same type as the original type.
    // The algorithm is to:
    //   - break the vector into scalars
    //   - apply the operation to each scalar
    //   - make a vector out the scalar results

    // get the types sorted out
    int numComponents = builder.getNumComponents(operands[0]);
    spv::Id scalarType = builder.getScalarTypeId(builder.getTypeId(operands[0]));
    std::vector<spv::Id> results;

    // do each scalar op
    for (int comp = 0; comp < numComponents; ++comp) {
        std::vector<unsigned int> indexes;
        indexes.push_back(comp);
        spv::IdImmediate scalar = { true, builder.createCompositeExtract(operands[0], scalarType, indexes) };
        std::vector<spv::IdImmediate> spvGroupOperands;
        if (op == spv::OpSubgroupReadInvocationKHR) {
            spvGroupOperands.push_back(scalar);
            spv::IdImmediate operand = { true, operands[1] };
            spvGroupOperands.push_back(operand);
        } else if (op == spv::OpSubgroupFirstInvocationKHR) {
            spvGroupOperands.push_back(scalar);
        } else if (op == spv::OpGroupBroadcast) {
            spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
            spvGroupOperands.push_back(scope);
            spvGroupOperands.push_back(scalar);
            spv::IdImmediate operand = { true, operands[1] };
            spvGroupOperands.push_back(operand);
        } else {
            spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
            spvGroupOperands.push_back(scope);
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
            spvGroupOperands.push_back(scalar);
        }

        results.push_back(builder.createOp(op, scalarType, spvGroupOperands));
    }

    // put the pieces together
    return builder.createCompositeConstruct(typeId, results);
}